

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O2

void write_double(bson *b,lua_Number d)

{
  int iVar1;
  ulong uVar2;
  
  bson_reserve(b,8);
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 8) {
    iVar1 = b->size;
    b->size = iVar1 + 1;
    b->ptr[iVar1] = (uint8_t)((ulong)d >> ((byte)uVar2 & 0x3f));
  }
  return;
}

Assistant:

static inline void
write_double(struct bson *b, lua_Number d) {
	union {
		double d;
		uint64_t i;
	} v;
	v.d = d;
	int i;
	bson_reserve(b,8);
	for (i=0;i<64;i+=8) {
		b->ptr[b->size++] = (v.i>>i) & 0xff;
	}
}